

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_wrapper.hpp
# Opt level: O2

future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_> __thiscall
HttpWrapper::request<(HttpWrapper::Methods)0>(HttpWrapper *this,Options *opts,Handler *handler)

{
  future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_> fVar1;
  anon_class_1_0_00000001 local_19;
  
  std::
  call_once<HttpWrapper::request<(HttpWrapper::Methods)0>(HttpWrapper::Options_const&,std::function<void(HttpWrapper::_Error_const&,HttpWrapper::_Response_const&)>const&)::_lambda()_1_>
            ((once_flag *)&once,&local_19);
  fVar1 = httpGet(this,opts,handler);
  fVar1.super___basic_future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_>)
         fVar1.super___basic_future<std::tuple<HttpWrapper::_Error,_HttpWrapper::_Response>_>.
         _M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

future<tuple<Error, Response>> request(const Options& opts, const Handler& handler = DEFAULT_HANDLER()) {
        call_once(once, [&](){
            curl_global_init(CURL_GLOBAL_DEFAULT);
            signal(SIGTERM, signalExit);
        });
        switch(methods) {
            case Methods::GET:
            {
                return httpGet(opts, handler);
            }
            case Methods::POST:
            {
                return httpPost(opts, handler);
            }
        }
    }